

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

string * __thiscall
cmCTestGIT::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  pointer pcVar1;
  long *plVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string git;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_rev_list;
  OutputLogger err;
  OneLineParser out;
  string local_188;
  long *local_168;
  long local_160;
  long local_158 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  OutputLogger local_130;
  undefined1 local_f0 [32];
  char *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90;
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_168 = local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_string_length
            );
  local_f0._0_8_ = local_f0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,local_168,local_160 + (long)local_168);
  local_d0 = local_c8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"rev-list","");
  local_b0[0] = (string *)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"-n","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"1","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"HEAD","");
  plVar2 = local_40;
  local_50[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"--","");
  __l._M_len = 6;
  __l._M_array = (iterator)local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148,__l,(allocator_type *)&local_130);
  lVar3 = -0xc0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  OneLineParser::OneLineParser((OneLineParser *)local_f0,this,"rl-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_130,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rl-err> ");
  local_188._M_string_length = 0;
  local_188.field_2._M_local_buf[0] = '\0';
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  cmCTestVC::RunChild((cmCTestVC *)this,&local_148,(OutputParser *)local_f0,
                      (OutputParser *)&local_130,&local_188,Auto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,
                    CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                             local_188.field_2._M_local_buf[0]) + 1);
  }
  local_130.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00b21468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.super_LineParser.Line._M_dataplus._M_p !=
      &local_130.super_LineParser.Line.field_2) {
    operator_delete(local_130.super_LineParser.Line._M_dataplus._M_p,
                    local_130.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_f0._0_8_ = &PTR__LineParser_00b21468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._24_8_ != &local_c8) {
    operator_delete((void *)local_f0._24_8_,local_c8._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  if (local_168 != local_158) {
    operator_delete(local_168,local_158[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::GetWorkingRevision()
{
  // Run plumbing "git rev-list" to get work tree revision.
  std::string git = this->CommandLineTool;
  std::vector<std::string> git_rev_list = { git, "rev-list", "-n",
                                            "1", "HEAD",     "--" };
  std::string rev;
  OneLineParser out(this, "rl-out> ", rev);
  OutputLogger err(this->Log, "rl-err> ");
  this->RunChild(git_rev_list, &out, &err);
  return rev;
}